

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void codecomp(FuncState *fs,OpCode op,int cond,expdesc *e1,expdesc *e2)

{
  int iVar1;
  int local_30;
  int temp;
  int o2;
  int o1;
  expdesc *e2_local;
  expdesc *e1_local;
  int cond_local;
  OpCode op_local;
  FuncState *fs_local;
  
  temp = luaK_exp2RK(fs,e1);
  iVar1 = luaK_exp2RK(fs,e2);
  freeexp(fs,e2);
  freeexp(fs,e1);
  local_30 = iVar1;
  e1_local._0_4_ = cond;
  if ((cond == 0) && (op != OP_EQ)) {
    e1_local._0_4_ = 1;
    local_30 = temp;
    temp = iVar1;
  }
  iVar1 = condjump(fs,op,(int)e1_local,temp,local_30);
  (e1->u).s.info = iVar1;
  e1->k = VJMP;
  return;
}

Assistant:

static void codecomp(FuncState*fs,OpCode op,int cond,expdesc*e1,
expdesc*e2){
int o1=luaK_exp2RK(fs,e1);
int o2=luaK_exp2RK(fs,e2);
freeexp(fs,e2);
freeexp(fs,e1);
if(cond==0&&op!=OP_EQ){
int temp;
temp=o1;o1=o2;o2=temp;
cond=1;
}
e1->u.s.info=condjump(fs,op,cond,o1,o2);
e1->k=VJMP;
}